

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::log_internal::LogMessage::
CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)1>
          (LogMessage *this,char ch,size_t num)

{
  size_type *psVar1;
  LogMessageData *pLVar2;
  LogMessageData *this_00;
  ulong uVar3;
  size_t sVar4;
  Span<char> *in_RCX;
  Span<char> msg;
  Span<char> msg_00;
  Span<char> encoded_remaining_copy;
  Span<char> local_48;
  
  pLVar2 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           .
           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl;
  if ((pLVar2->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
    (pLVar2->encoded_remaining_actual_do_not_use_directly).ptr_ = (pLVar2->encoded_buf)._M_elems;
    (pLVar2->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
    LogMessageData::InitializeEncodingAndFormat(pLVar2);
  }
  local_48.ptr_ = (pLVar2->encoded_remaining_actual_do_not_use_directly).ptr_;
  local_48.len_ = (pLVar2->encoded_remaining_actual_do_not_use_directly).len_;
  sVar4 = VarintSize(0xffffffffffffffff);
  msg = EncodeMessageStart((log_internal *)0x7,num + sVar4 + 1,(uint64_t)&local_48,in_RCX);
  msg_00 = EncodeMessageStart((log_internal *)0x1,num,(uint64_t)&local_48,in_RCX);
  if (msg_00.ptr_ == (pointer)0x0) {
    pLVar2 = (this->data_)._M_t.
             super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             .
             super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
             ._M_head_impl;
    if ((pLVar2->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
      (pLVar2->encoded_remaining_actual_do_not_use_directly).ptr_ = (pLVar2->encoded_buf)._M_elems;
      (pLVar2->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
      LogMessageData::InitializeEncodingAndFormat(pLVar2);
    }
    this_00 = (this->data_)._M_t.
              super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
              ._M_t.
              super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
              .
              super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
              ._M_head_impl;
    if ((this_00->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
      (this_00->encoded_remaining_actual_do_not_use_directly).ptr_ = (this_00->encoded_buf)._M_elems
      ;
      (this_00->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
      LogMessageData::InitializeEncodingAndFormat(this_00);
    }
    uVar3 = (pLVar2->encoded_remaining_actual_do_not_use_directly).len_;
    psVar1 = &(this_00->encoded_remaining_actual_do_not_use_directly).len_;
    if (uVar3 < *psVar1) {
      __assert_fail("false && \"size() >= n\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/types/span.h"
                    ,0x1b5,
                    "auto absl::Span<char>::remove_suffix(size_type)::(anonymous class)::operator()() const [T = char]"
                   );
    }
    (pLVar2->encoded_remaining_actual_do_not_use_directly).len_ = uVar3 - *psVar1;
  }
  else {
    if (local_48.len_ < num) {
      num = local_48.len_;
    }
    memset(local_48.ptr_,(uint)(byte)ch,num);
    if (local_48.len_ < num) {
      __assert_fail("false && \"size() >= n\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/types/span.h"
                    ,0x1ac,
                    "auto absl::Span<char>::remove_prefix(size_type)::(anonymous class)::operator()() const [T = char]"
                   );
    }
    local_48.ptr_ = local_48.ptr_ + num;
    local_48.len_ = local_48.len_ - num;
    EncodeMessageLength(msg_00,&local_48);
    EncodeMessageLength(msg,&local_48);
    pLVar2 = (this->data_)._M_t.
             super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             .
             super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
             ._M_head_impl;
    if ((pLVar2->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
      (pLVar2->encoded_remaining_actual_do_not_use_directly).ptr_ = (pLVar2->encoded_buf)._M_elems;
      (pLVar2->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
      LogMessageData::InitializeEncodingAndFormat(pLVar2);
    }
    (pLVar2->encoded_remaining_actual_do_not_use_directly).ptr_ = local_48.ptr_;
    (pLVar2->encoded_remaining_actual_do_not_use_directly).len_ = local_48.len_;
  }
  return;
}

Assistant:

void LogMessage::CopyToEncodedBuffer(char ch, size_t num) {
  auto encoded_remaining_copy = data_->encoded_remaining();
  constexpr uint8_t tag_value = str_type == StringType::kLiteral
                                    ? ValueTag::kStringLiteral
                                    : ValueTag::kString;
  auto value_start = EncodeMessageStart(
      EventTag::kValue,
      BufferSizeFor(tag_value, WireType::kLengthDelimited) + num,
      &encoded_remaining_copy);
  auto str_start = EncodeMessageStart(tag_value, num, &encoded_remaining_copy);
  if (str_start.data()) {
    // The field headers fit.
    log_internal::AppendTruncated(ch, num, encoded_remaining_copy);
    EncodeMessageLength(str_start, &encoded_remaining_copy);
    EncodeMessageLength(value_start, &encoded_remaining_copy);
    data_->encoded_remaining() = encoded_remaining_copy;
  } else {
    // The field header(s) did not fit; zero `encoded_remaining()` so we don't
    // write anything else later.
    data_->encoded_remaining().remove_suffix(data_->encoded_remaining().size());
  }
}